

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::printActiveBeam(Collimator *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  int i;
  ulong uVar3;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> angle;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_50
  ;
  
  for (p_Var2 = (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header
      ; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    pair(&local_50,
         (pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          *)(p_Var2 + 1));
    poVar1 = std::operator<<((ostream *)&std::cout,"Angle: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.first);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)local_50.second.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_50.second.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          local_50.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3].first);
      poVar1 = std::operator<<(poVar1," , ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,local_50.second.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar3].second);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&local_50.second.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  return;
}

Assistant:

void Collimator::printActiveBeam() {
    for(auto angle:angle_row_beam_active){
      cout << "Angle: " << angle.first << endl;
      for (int i =0; i < angle.second.size(); i++) {
         cout << angle.second[i].first << " , " << angle.second[i].second<< endl;
      }
    }
  }